

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::
Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
::Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
          *table,size_t pos,SiPair *row,uint skip)

{
  SiPair *params;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  unsigned_long *t;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 func;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  Maybe<unsigned_long> MVar3;
  ArrayPtr<kj::_::(anonymous_namespace)::SiPair> AVar4;
  undefined1 *local_e8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_e0;
  size_t local_d8;
  SiPair **local_d0;
  SiPair *local_c8;
  undefined1 local_c0 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_h:478:5)>_conflict
  _kjDefer480;
  bool success;
  SiPair *local_68;
  size_t local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  NullableValue<unsigned_long> existing;
  TypeByIndex<1UL,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
  *indexObj;
  uint skip_local;
  SiPair *row_local;
  size_t pos_local;
  Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
  *table_local;
  Maybe<unsigned_long> *result;
  
  row_local = (SiPair *)pos;
  pos_local = (size_t)table;
  table_local = (Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
                 *)this;
  if (skip == 0) {
    MVar3 = Impl<1UL,_false>::insert((Impl<1UL,_false> *)this,table,pos,row,0);
    aVar1 = MVar3.ptr.field_1;
  }
  else {
    aVar1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            get<0ul,kj::_::Tuple<kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>&>
                      (&table->indexes);
    existing.field_1 = aVar1;
    AVar4 = Vector<kj::_::(anonymous_namespace)::SiPair>::asPtr
                      ((Vector<kj::_::(anonymous_namespace)::SiPair> *)pos_local);
    params = row_local;
    HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>::
    keyForRow<kj::_::(anonymous_namespace)::SiPair&>
              ((HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *)existing.field_1,row);
    local_68 = AVar4.ptr;
    local_60 = AVar4.size_;
    AVar4.size_ = (size_t)local_68;
    AVar4.ptr = (SiPair *)aVar1.value;
    HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>::
    insert<kj::_::(anonymous_namespace)::SiPair,kj::StringPtr>
              ((HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *)local_58,AVar4,
               local_60,&params->str);
    other = _::readMaybe<unsigned_long>((Maybe<unsigned_long> *)local_58);
    _::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_48,other);
    Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_58);
    puVar2 = _::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_48);
    if (puVar2 != (unsigned_long *)0x0) {
      t = _::NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_48);
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,t);
    }
    _::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_48);
    aVar1 = func;
    if (puVar2 == (unsigned_long *)0x0) {
      _kjDefer480._47_1_ = 0;
      local_e8 = &_kjDefer480.field_0x2f;
      local_e0 = existing.field_1;
      local_d8 = pos_local;
      local_d0 = &row_local;
      local_c8 = row;
      defer<kj::Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>::Impl<0ul,false>::insert(kj::Table<kj::_::(anonymous_namespace)::SiPair,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>>&,unsigned_long,kj::_::(anonymous_namespace)::SiPair&,unsigned_int)::_lambda()_1_>
                ((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_h:478:5)>_conflict
                  *)local_c0,(kj *)&local_e8,(Type_conflict *)func);
      Impl<1UL,_false>::insert
                ((Impl<1UL,_false> *)this,
                 (Table<kj::_::(anonymous_namespace)::SiPair,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::SiPairIntHasher>_>
                  *)pos_local,(size_t)row_local,row,skip);
      _kjDefer480._47_1_ =
           Maybe<unsigned_long>::operator==((Maybe<unsigned_long> *)this,(void *)0x0);
      _::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.h:478:5)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_h:478:5)>
                   *)local_c0);
      aVar1 = extraout_RDX;
    }
  }
  MVar3.ptr.field_1.value = aVar1.value;
  MVar3.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar3.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_MAYBE(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return *existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == nullptr;
    return result;
  }